

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O2

void Cmd_teamlist(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined4 in_register_00000014;
  uint uiTeam;
  ulong uVar1;
  long lVar2;
  
  Printf("Defined teams are as follows:\n",who,CONCAT44(in_register_00000014,key));
  lVar2 = 0x10;
  for (uVar1 = 0; uVar1 < Teams.Count; uVar1 = uVar1 + 1) {
    Printf("%d : %s\n",uVar1 & 0xffffffff,
           *(undefined8 *)((long)&(Teams.Array)->m_iPlayerCount + lVar2));
    lVar2 = lVar2 + 0x38;
  }
  Printf("End of team list.\n");
  return;
}

Assistant:

CCMD (teamlist)
{
	Printf ("Defined teams are as follows:\n");

	for (unsigned int uiTeam = 0; uiTeam < Teams.Size (); uiTeam++)
		Printf ("%d : %s\n", uiTeam, Teams[uiTeam].GetName ());

	Printf ("End of team list.\n");
}